

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetBytesDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if ((*(string **)(descriptor + 0x40))->_M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"pb::ByteString.Empty",(allocator *)&local_50);
  }
  else {
    StringToBase64(&local_30,*(string **)(descriptor + 0x40));
    std::operator+(&local_50,"pb::ByteString.FromBase64(\"",&local_30);
    std::operator+(__return_storage_ptr__,&local_50,"\")");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetBytesDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "pb::ByteString.Empty";
    else
        return "pb::ByteString.FromBase64(\"" + StringToBase64(descriptor->default_value_string()) + "\")";
}